

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap-linux.c
# Opt level: O0

long linux_if_drops(char *if_name)

{
  size_t sVar1;
  FILE *__stream;
  char *pcVar2;
  char **ppcVar3;
  bool bVar4;
  char *local_238;
  long dropped_pkts;
  int if_name_sz;
  int field_to_convert;
  FILE *file;
  char *bufptr;
  char buffer [512];
  char *if_name_local;
  
  dropped_pkts._4_4_ = 3;
  buffer._504_8_ = if_name;
  sVar1 = strlen(if_name);
  local_238 = (char *)0x0;
  __stream = fopen("/proc/net/dev","r");
  if (__stream == (FILE *)0x0) {
    if_name_local = (char *)0x0;
  }
  else {
    do {
      while( true ) {
        pcVar2 = fgets((char *)&bufptr,0x200,__stream);
        if (pcVar2 == (char *)0x0) goto LAB_001240c6;
        if ((dropped_pkts._4_4_ == 4) ||
           (pcVar2 = strstr((char *)&bufptr,"bytes"), pcVar2 == (char *)0x0)) break;
        dropped_pkts._4_4_ = 4;
      }
      ppcVar3 = (char **)strstr((char *)&bufptr,(char *)buffer._504_8_);
    } while ((ppcVar3 == (char **)0x0) ||
            (((ppcVar3 != &bufptr && (*(char *)((long)ppcVar3 + -1) != ' ')) ||
             (*(char *)((long)ppcVar3 + (long)(int)sVar1) != ':'))));
    file = (FILE *)((long)ppcVar3 + (long)(int)sVar1 + 1);
    while( true ) {
      dropped_pkts._4_4_ = dropped_pkts._4_4_ + -1;
      bVar4 = false;
      if (dropped_pkts._4_4_ != 0) {
        bVar4 = (char)file->_flags != '\0';
      }
      if (!bVar4) break;
      do {
        bVar4 = false;
        if ((char)file->_flags != '\0') {
          bVar4 = (char)file->_flags == ' ';
          file = (FILE *)((long)&file->_flags + 1);
        }
      } while (bVar4);
      do {
        bVar4 = false;
        if ((char)file->_flags != '\0') {
          bVar4 = (char)file->_flags != ' ';
          file = (FILE *)((long)&file->_flags + 1);
        }
      } while (bVar4);
    }
    while( true ) {
      bVar4 = false;
      if ((char)file->_flags != '\0') {
        bVar4 = (char)file->_flags == ' ';
      }
      if (!bVar4) break;
      file = (FILE *)((long)&file->_flags + 1);
    }
    if ((char)file->_flags != '\0') {
      local_238 = (char *)strtol((char *)file,(char **)0x0,10);
    }
LAB_001240c6:
    fclose(__stream);
    if_name_local = local_238;
  }
  return (long)if_name_local;
}

Assistant:

static long int
linux_if_drops(const char * if_name)
{
	char buffer[512];
	char * bufptr;
	FILE * file;
	int field_to_convert = 3, if_name_sz = strlen(if_name);
	long int dropped_pkts = 0;

	file = fopen("/proc/net/dev", "r");
	if (!file)
		return 0;

	while (!dropped_pkts && fgets( buffer, sizeof(buffer), file ))
	{
		/* 	search for 'bytes' -- if its in there, then
			that means we need to grab the fourth field. otherwise
			grab the third field. */
		if (field_to_convert != 4 && strstr(buffer, "bytes"))
		{
			field_to_convert = 4;
			continue;
		}

		/* find iface and make sure it actually matches -- space before the name and : after it */
		if ((bufptr = strstr(buffer, if_name)) &&
			(bufptr == buffer || *(bufptr-1) == ' ') &&
			*(bufptr + if_name_sz) == ':')
		{
			bufptr = bufptr + if_name_sz + 1;

			/* grab the nth field from it */
			while( --field_to_convert && *bufptr != '\0')
			{
				while (*bufptr != '\0' && *(bufptr++) == ' ');
				while (*bufptr != '\0' && *(bufptr++) != ' ');
			}

			/* get rid of any final spaces */
			while (*bufptr != '\0' && *bufptr == ' ') bufptr++;

			if (*bufptr != '\0')
				dropped_pkts = strtol(bufptr, NULL, 10);

			break;
		}
	}

	fclose(file);
	return dropped_pkts;
}